

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_record.c
# Opt level: O1

int lj_record_mm_lookup(jit_State *J,RecordIndex *ix,MMS mm)

{
  uint32_t uVar1;
  IRRef1 IVar2;
  uint uVar3;
  TRef TVar4;
  TRef TVar5;
  uint uVar6;
  cTValue *pcVar7;
  void *ptr;
  ulong uVar8;
  GCobj *o;
  TValue local_78;
  uint local_70;
  undefined4 local_6c;
  TRef local_48;
  TRef local_44;
  undefined4 local_40;
  undefined4 local_34;
  
  uVar6 = ix->tab;
  uVar3 = uVar6 & 0x1f000000;
  if (uVar3 == 0xc000000) {
    ptr = (void *)(ulong)(ix->tabv).u32.lo;
    o = (GCobj *)(ulong)*(uint *)((long)ptr + 0x10);
    uVar3 = (uint)*(byte *)((long)ptr + 6);
    if (1 < uVar3) {
      if (uVar3 == 2) {
        TVar5 = lj_ir_kptr_(J,IR_KPTR,ptr);
        IVar2 = (IRRef1)TVar5;
        (J->fold).ins.field_0.ot = 0x885;
      }
      else {
        (J->fold).ins.field_0.op1 = (IRRef1)uVar6;
        *(undefined4 *)((long)&(J->fold).ins.field_1.op12 + 2) = 0x4410000c;
        uVar6 = lj_opt_fold(J);
        TVar5 = lj_ir_kint(J,uVar3);
        IVar2 = (IRRef1)TVar5;
        (J->fold).ins.field_0.ot = 0x893;
      }
      (J->fold).ins.field_0.op1 = (IRRef1)uVar6;
      (J->fold).ins.field_0.op2 = IVar2;
      lj_opt_fold(J);
LAB_0014084f:
      pcVar7 = lj_tab_getstr(&o->tab,(GCstr *)(ulong)*(uint *)((long)J + (ulong)mm * 4 + -0xb0));
      if (pcVar7 == (cTValue *)0x0) {
        return 0;
      }
      uVar1 = (pcVar7->field_2).it;
      if ((uVar1 != 0xfffffff4) && (uVar1 != 0xfffffff7)) {
        if (uVar1 != 0xffffffff) {
          lj_trace_err(J,LJ_TRERR_BADTYPE);
        }
        return 0;
      }
      (ix->mobjv).u32 = *(anon_struct_8_2_f9ee98fb_for_u32 *)pcVar7;
      TVar5 = lj_ir_kgc(J,(GCobj *)(ulong)(pcVar7->u32).lo,
                        (uint)((pcVar7->field_2).it != 0xfffffff7) * 3 + IRT_FUNC);
      ix->mobj = TVar5;
      ix->mtv = (GCtab *)o;
      ix->mt = 0x7fff;
      return 1;
    }
    IVar2 = 0xb;
  }
  else {
    if (uVar3 != 0xb000000) {
      uVar6 = (ix->tabv).field_2.it;
      uVar8 = 0x23;
      if ((0xfffeffff < uVar6) && (uVar8 = 0x19, (uVar6 & 0xffff8000) != 0xffff0000)) {
        uVar8 = (ulong)(0x15 - uVar6);
      }
      o = (GCobj *)(ulong)*(uint *)((long)J + uVar8 * 4 + -0xb0);
      if (o == (GCobj *)0x0) {
        ix->mt = 0x7fff;
        return 0;
      }
      if (uVar3 == 0xa000000) goto LAB_0014084f;
      local_48 = lj_ir_kgc(J,o,IRT_TAB);
      ix->mt = local_48;
      goto LAB_00140769;
    }
    o = (GCobj *)(ulong)*(uint *)((ulong)(ix->tabv).u32.lo + 0x10);
    IVar2 = 5;
  }
  (J->fold).ins.field_0.ot = 0x440b;
  (J->fold).ins.field_0.op1 = (IRRef1)uVar6;
  (J->fold).ins.field_0.op2 = IVar2;
  TVar4 = lj_opt_fold(J);
  TVar5 = 0x7fff;
  if (o != (GCobj *)0x0) {
    TVar5 = TVar4;
  }
  ix->mt = TVar5;
  local_48 = TVar4;
  TVar5 = lj_ir_knull(J,IRT_TAB);
  (J->fold).ins.field_0.ot = (ushort)(o != (GCobj *)0x0) << 8 | 0x88b;
  (J->fold).ins.field_0.op1 = (IRRef1)TVar4;
  (J->fold).ins.field_0.op2 = (IRRef1)TVar5;
  lj_opt_fold(J);
LAB_00140769:
  if (o == (GCobj *)0x0) {
    return 0;
  }
  uVar6 = *(uint *)((long)J + (ulong)mm * 4 + -0xb0);
  pcVar7 = lj_tab_getstr(&o->tab,&((GCobj *)(ulong)uVar6)->str);
  if ((pcVar7 != (cTValue *)0x0) && ((pcVar7->field_2).it != 0xffffffff)) {
    (ix->mobjv).field_2 = (anon_struct_8_2_fd66bcdd_for_TValue_2)*pcVar7;
  }
  ix->mtv = (GCtab *)o;
  local_78.u32.lo = (uint32_t)o;
  local_78.field_2.it = 0xfffffff4;
  local_6c = 0xfffffffb;
  local_70 = uVar6;
  local_44 = lj_ir_kgc(J,(GCobj *)(ulong)uVar6,IRT_STR);
  local_40 = 0;
  local_34 = 0;
  TVar5 = lj_record_idx(J,(RecordIndex *)&local_78.field_2);
  ix->mobj = TVar5;
  return (uint)((TVar5 & 0x1f000000) != 0);
}

Assistant:

int lj_record_mm_lookup(jit_State *J, RecordIndex *ix, MMS mm)
{
  RecordIndex mix;
  GCtab *mt;
  if (tref_istab(ix->tab)) {
    mt = tabref(tabV(&ix->tabv)->metatable);
    mix.tab = emitir(IRT(IR_FLOAD, IRT_TAB), ix->tab, IRFL_TAB_META);
  } else if (tref_isudata(ix->tab)) {
    int udtype = udataV(&ix->tabv)->udtype;
    mt = tabref(udataV(&ix->tabv)->metatable);
    /* The metatables of special userdata objects are treated as immutable. */
    if (udtype > UDTYPE_IO_FILE) {
      cTValue *mo;
      if (LJ_HASFFI && udtype == UDTYPE_FFI_CLIB) {
	/* Specialize to the C library namespace object. */
	emitir(IRTG(IR_EQ, IRT_PGC), ix->tab, lj_ir_kptr(J, udataV(&ix->tabv)));
      } else {
	/* Specialize to the type of userdata. */
	TRef tr = emitir(IRT(IR_FLOAD, IRT_U8), ix->tab, IRFL_UDATA_UDTYPE);
	emitir(IRTGI(IR_EQ), tr, lj_ir_kint(J, udtype));
      }
  immutable_mt:
      mo = lj_tab_getstr(mt, mmname_str(J2G(J), mm));
      if (!mo || tvisnil(mo))
	return 0;  /* No metamethod. */
      /* Treat metamethod or index table as immutable, too. */
      if (!(tvisfunc(mo) || tvistab(mo)))
	lj_trace_err(J, LJ_TRERR_BADTYPE);
      copyTV(J->L, &ix->mobjv, mo);
      ix->mobj = lj_ir_kgc(J, gcV(mo), tvisfunc(mo) ? IRT_FUNC : IRT_TAB);
      ix->mtv = mt;
      ix->mt = TREF_NIL;  /* Dummy value for comparison semantics. */
      return 1;  /* Got metamethod or index table. */
    }
    mix.tab = emitir(IRT(IR_FLOAD, IRT_TAB), ix->tab, IRFL_UDATA_META);
  } else {
    /* Specialize to base metatable. Must flush mcode in lua_setmetatable(). */
    mt = tabref(basemt_obj(J2G(J), &ix->tabv));
    if (mt == NULL) {
      ix->mt = TREF_NIL;
      return 0;  /* No metamethod. */
    }
    /* The cdata metatable is treated as immutable. */
    if (LJ_HASFFI && tref_iscdata(ix->tab)) goto immutable_mt;
#if LJ_GC64
    /* TODO: fix ARM32 asm_fload(), so we can use this for all archs. */
    ix->mt = mix.tab = lj_ir_ggfload(J, IRT_TAB,
      GG_OFS(g.gcroot[GCROOT_BASEMT+itypemap(&ix->tabv)]));
#else
    ix->mt = mix.tab = lj_ir_ktab(J, mt);
#endif
    goto nocheck;
  }
  ix->mt = mt ? mix.tab : TREF_NIL;
  emitir(IRTG(mt ? IR_NE : IR_EQ, IRT_TAB), mix.tab, lj_ir_knull(J, IRT_TAB));
nocheck:
  if (mt) {
    GCstr *mmstr = mmname_str(J2G(J), mm);
    cTValue *mo = lj_tab_getstr(mt, mmstr);
    if (mo && !tvisnil(mo))
      copyTV(J->L, &ix->mobjv, mo);
    ix->mtv = mt;
    settabV(J->L, &mix.tabv, mt);
    setstrV(J->L, &mix.keyv, mmstr);
    mix.key = lj_ir_kstr(J, mmstr);
    mix.val = 0;
    mix.idxchain = 0;
    ix->mobj = lj_record_idx(J, &mix);
    return !tref_isnil(ix->mobj);  /* 1 if metamethod found, 0 if not. */
  }
  return 0;  /* No metamethod. */
}